

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_setlocal(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  lua_Integer lVar2;
  lua_Integer lVar3;
  char *s;
  int arg;
  lua_Debug ar;
  
  L_00 = getthread(L,&arg);
  lVar2 = luaL_checkinteger(L,arg + 1);
  lVar3 = luaL_checkinteger(L,arg + 2);
  iVar1 = lua_getstack(L_00,(int)lVar2,&ar);
  if (iVar1 == 0) {
    iVar1 = luaL_argerror(L,arg + 1,"level out of range");
  }
  else {
    luaL_checkany(L,arg + 3);
    lua_settop(L,arg + 3);
    iVar1 = 1;
    checkstack(L,L_00,1);
    lua_xmove(L,L_00,1);
    s = lua_setlocal(L_00,&ar,(int)lVar3);
    if (s == (char *)0x0) {
      lua_settop(L_00,-2);
    }
    lua_pushstring(L,s);
  }
  return iVar1;
}

Assistant:

static int db_setlocal (lua_State *L) {
  int arg;
  const char *name;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  int level = (int)luaL_checkinteger(L, arg + 1);
  int nvar = (int)luaL_checkinteger(L, arg + 2);
  if (l_unlikely(!lua_getstack(L1, level, &ar)))  /* out of range? */
    return luaL_argerror(L, arg+1, "level out of range");
  luaL_checkany(L, arg+3);
  lua_settop(L, arg+3);
  checkstack(L, L1, 1);
  lua_xmove(L, L1, 1);
  name = lua_setlocal(L1, &ar, nvar);
  if (name == NULL)
    lua_pop(L1, 1);  /* pop value (if not popped by 'lua_setlocal') */
  lua_pushstring(L, name);
  return 1;
}